

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  time_t tVar2;
  ostream *poVar3;
  time_t elapsedTime;
  time_t endTime;
  time_t startTime;
  
  std::operator<<((ostream *)&std::cout,"Test DNN begin\n");
  tfs::randomSeed(0);
  tVar1 = time((time_t *)0x0);
  testMatrix();
  testBuilder();
  testFullyConnected();
  testCifar10();
  testSimple();
  testCircle();
  testSpiral();
  test2Layer();
  testIO();
  tVar2 = time((time_t *)0x0);
  std::operator<<((ostream *)&std::cout,"Test DNN end. Elapsed time: ");
  if (tVar2 - tVar1 == 1) {
    std::operator<<((ostream *)&std::cout,"1 second.\n");
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,tVar2 - tVar1);
    std::operator<<(poVar3," seconds.\n");
  }
  return 0;
}

Assistant:

int
main( int argc, const char * argv[] ) {
    std::cout << "Test DNN begin\n";
    
    tfs::randomSeed( 1024 );    // Consistent behavior during testing.  Effects DNN initialization.

    const time_t startTime = time( 0 );
    
    testMatrix();
    testBuilder();
    testFullyConnected();
    testCifar10();
    testSimple();
    testCircle();
    testSpiral();               // testSpiral may take a a few minutes, depending on your computer.
    test2Layer();
    testIO();
    
    const time_t endTime     = time( 0 );
    const time_t elapsedTime = endTime - startTime;
    
    std::cout << "Test DNN end. Elapsed time: ";
    if( elapsedTime == 1 ) {
       std::cout << "1 second.\n";
    } else {
        std::cout << elapsedTime << " seconds.\n";  // From my 2009 MacBook pro: Elapsed time: 15 seconds.
    }
    return 0;
    
}